

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

void If_ManComputeRequired(If_Man_t *p)

{
  float fVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  void *pvVar3;
  If_Par_t *pIVar4;
  uint *puVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  If_Obj_t *pIVar9;
  If_Man_t *pIVar10;
  Tim_Man_t *pTVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  If_ManMarkMapping(p);
  pTVar11 = p->pManTim;
  pIVar10 = p;
  fVar13 = If_ManDelayMax(p,0);
  p->RequiredGlo = fVar13;
  pIVar4 = p->pPars;
  if (pTVar11 == (Tim_Man_t *)0x0) {
    if ((pIVar4->pTimesReq == (float *)0x0) || (pIVar4->fAreaOnly != 0)) {
      if ((pIVar4->nRelaxRatio != 0) &&
         ((pIVar4->DelayTargetNew == 0.0 && (!NAN(pIVar4->DelayTargetNew))))) {
        pIVar4->DelayTargetNew = (((float)pIVar4->nRelaxRatio + 100.0) * fVar13) / 100.0;
      }
      fVar14 = pIVar4->DelayTarget;
      if ((fVar14 != -1.0) || (NAN(fVar14))) {
        if (fVar13 <= fVar14 + p->fEpsilon) {
          if (fVar13 < fVar14 - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = fVar14;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          Abc_Print((int)pIVar10,
                    "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)fVar14);
          pIVar4 = p->pPars;
        }
      }
      else if (0.0 < pIVar4->DelayTargetNew) {
        p->RequiredGlo = pIVar4->DelayTargetNew;
      }
      if (pIVar4->fAreaOnly != 0) {
        return;
      }
      if (pIVar4->fDoAverage == 0) {
        if (pIVar4->fLatchPaths == 0) {
          for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
            pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
            *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x34) = p->RequiredGlo;
          }
        }
        else {
          for (iVar7 = p->nObjs[3] - pIVar4->nLatchesCo; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1)
          {
            pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
            *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x34) = p->RequiredGlo;
          }
        }
      }
      else if (pIVar4->nRelaxRatio == 0) {
        for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
          pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
          *(undefined4 *)(*(long *)((long)pvVar3 + 0x18) + 0x34) =
               *(undefined4 *)(*(long *)((long)pvVar3 + 0x18) + 0x5c);
        }
      }
      else {
        for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
          pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
          *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x34) =
               (((float)p->pPars->nRelaxRatio + 100.0) *
               *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x5c)) / 100.0;
        }
      }
    }
    else {
      uVar8 = 0;
      for (lVar12 = 0; p_00 = p->vCos, lVar12 < p_00->nSize; lVar12 = lVar12 + 1) {
        pvVar3 = Vec_PtrEntry(p_00,(int)lVar12);
        fVar13 = *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x5c);
        fVar14 = p->pPars->pTimesReq[lVar12];
        fVar15 = p->fEpsilon + fVar14;
        fVar1 = fVar13;
        if (fVar13 <= fVar15) {
          fVar1 = fVar14;
        }
        uVar8 = uVar8 + (fVar15 < fVar13);
        *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x34) = fVar1;
      }
      if ((uVar8 != 0) && (p->fReqTimeWarn == 0)) {
        pcVar6 = "s";
        if (uVar8 == 1) {
          pcVar6 = "";
        }
        Abc_Print((int)p_00,
                  "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                  ,(ulong)uVar8,pcVar6);
        p->fReqTimeWarn = 1;
      }
    }
    for (uVar8 = 0; (int)uVar8 < p->vObjsRev->nSize; uVar8 = uVar8 + 1) {
      pIVar9 = (If_Obj_t *)(ulong)uVar8;
      pvVar3 = Vec_PtrEntry(p->vObjsRev,uVar8);
      if (*(int *)((long)pvVar3 + 0xc) != 0) {
        If_CutPropagateRequired
                  (p,pIVar9,(If_Cut_t *)((long)pvVar3 + 0x50),*(float *)((long)pvVar3 + 0x34));
      }
    }
  }
  else {
    if (((pIVar4->nRelaxRatio != 0) && (pIVar4->DelayTargetNew == 0.0)) &&
       (!NAN(pIVar4->DelayTargetNew))) {
      pIVar4->DelayTargetNew = (((float)pIVar4->nRelaxRatio + 100.0) * fVar13) / 100.0;
    }
    fVar14 = pIVar4->DelayTarget;
    if ((fVar14 != -1.0) || (NAN(fVar14))) {
      if (fVar13 <= fVar14 + p->fEpsilon) {
        if (fVar13 < fVar14 - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = fVar14;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        Abc_Print((int)pIVar10,
                  "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)fVar14);
        pIVar4 = p->pPars;
      }
    }
    else if (0.0 < pIVar4->DelayTargetNew) {
      p->RequiredGlo = pIVar4->DelayTargetNew;
    }
    if (pIVar4->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        pIVar4 = p->pPars;
        if (pIVar4->fDoAverage == 0) {
          if (pIVar4->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            for (iVar7 = pIVar4->nLatchesCoBox; iVar2 = p->nObjs[3] - pIVar4->nLatchesCo,
                iVar7 < iVar2; iVar7 = iVar7 + 1) {
              Vec_PtrEntry(p->vCos,iVar7);
              Tim_ManSetCoRequired(p->pManTim,iVar7,1e+20);
              pIVar4 = p->pPars;
            }
            for (; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
              Vec_PtrEntry(p->vCos,iVar2);
              Tim_ManSetCoRequired(p->pManTim,iVar2,p->RequiredGlo);
            }
          }
        }
        else if (pIVar4->nRelaxRatio == 0) {
          for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
            pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
            Tim_ManSetCoRequired(p->pManTim,iVar7,*(float *)(*(long *)((long)pvVar3 + 0x18) + 0x5c))
            ;
          }
        }
        else {
          for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
            pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
            Tim_ManSetCoRequired
                      (p->pManTim,iVar7,
                       (((float)p->pPars->nRelaxRatio + 100.0) *
                       *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x5c)) / 100.0);
          }
        }
      }
      else {
        if (p->nObjs[3] != p->vCoAttrs->nSize) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
          pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
          iVar2 = Vec_IntEntry(p->vCoAttrs,iVar7);
          if (iVar2 != -1) {
            iVar2 = Vec_IntEntry(p->vCoAttrs,iVar7);
            if (iVar2 == 0) {
              pTVar11 = p->pManTim;
              fVar13 = p->RequiredGlo;
            }
            else {
              iVar2 = Vec_IntEntry(p->vCoAttrs,iVar7);
              if (iVar2 == 1) {
                pTVar11 = p->pManTim;
                fVar13 = *(float *)(*(long *)((long)pvVar3 + 0x18) + 0x5c);
              }
              else {
                iVar2 = Vec_IntEntry(p->vCoAttrs,iVar7);
                if (iVar2 != 2) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                                ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
                }
                pTVar11 = p->pManTim;
                fVar13 = 1e+20;
              }
            }
            Tim_ManSetCoRequired(pTVar11,iVar7,fVar13);
          }
        }
      }
      for (uVar8 = 0; (int)uVar8 < p->vObjsRev->nSize; uVar8 = uVar8 + 1) {
        pIVar9 = (If_Obj_t *)(ulong)uVar8;
        puVar5 = (uint *)Vec_PtrEntry(p->vObjsRev,uVar8);
        switch(*puVar5 & 0xf) {
        case 1:
          break;
        case 2:
          Tim_ManSetCiRequired(p->pManTim,puVar5[2],(float)puVar5[0xd]);
          break;
        case 3:
          fVar14 = Tim_ManGetCoRequired(p->pManTim,puVar5[2]);
          fVar13 = *(float *)(*(long *)(puVar5 + 6) + 0x34);
          if (fVar13 <= fVar14) {
            fVar14 = fVar13;
          }
          *(float *)(*(long *)(puVar5 + 6) + 0x34) = fVar14;
          break;
        case 4:
          if (puVar5[3] != 0) {
            If_CutPropagateRequired(p,pIVar9,(If_Cut_t *)(puVar5 + 0x14),(float)puVar5[0xd]);
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                        ,0x202,"void If_ManComputeRequired(If_Man_t *)");
        }
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}